

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O3

bool __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
unsynchronized_pop<depspawn::internal::TaskPool::Task*>
          (queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>> *this,
          Task **ret)

{
  uint uVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint *puVar7;
  
  do {
    while( true ) {
      uVar1 = *(uint *)this;
      uVar4 = uVar1 & 0xffff;
      sVar2 = (short)uVar1;
      puVar6 = (uint *)((ulong)(uVar4 << 6) + *(long *)(this + 0x80));
      if (sVar2 == *(short *)(this + 0x88)) {
        puVar6 = (uint *)0x0;
      }
      uVar5 = *puVar6 & 0xffff;
      puVar7 = (uint *)((ulong)(uVar5 << 6) + *(long *)(this + 0x80));
      if ((short)*puVar6 == *(short *)(this + 0x88)) {
        puVar7 = (uint *)0x0;
      }
      sVar3 = (short)*(uint *)(this + 0x40);
      if (sVar2 != sVar3) break;
      if (puVar7 == (uint *)0x0) goto LAB_0010c9a3;
      LOCK();
      *(uint *)(this + 0x40) = (*(uint *)(this + 0x40) & 0xffff0000) + uVar5 + 0x10000;
      UNLOCK();
    }
  } while (puVar7 == (uint *)0x0);
  *ret = *(Task **)(puVar7 + 2);
  LOCK();
  *(uint *)this = (uVar1 & 0xffff0000) + uVar5 + 0x10000;
  UNLOCK();
  uVar1 = *(uint *)(this + 0x90);
  *(short *)(*(long *)(this + 0x80) + (ulong)(uVar4 << 6)) = (short)uVar1;
  LOCK();
  *(uint *)(this + 0x90) = uVar1 & 0xffff0000 | uVar4;
  UNLOCK();
LAB_0010c9a3:
  return sVar2 != sVar3;
}

Assistant:

bool pop (U & ret)
    {
        for (;;) {
            tagged_node_handle head = head_.load(memory_order_acquire);
            node * head_ptr = pool.get_pointer(head);

            tagged_node_handle tail = tail_.load(memory_order_acquire);
            tagged_node_handle next = head_ptr->next.load(memory_order_acquire);
            node * next_ptr = pool.get_pointer(next);

            tagged_node_handle head2 = head_.load(memory_order_acquire);
            if (BOOST_LIKELY(head == head2)) {
                if (pool.get_handle(head) == pool.get_handle(tail)) {
                    if (next_ptr == 0)
                        return false;

                    tagged_node_handle new_tail(pool.get_handle(next), tail.get_next_tag());
                    tail_.compare_exchange_strong(tail, new_tail);

                } else {
                    if (next_ptr == 0)
                        /* this check is not part of the original algorithm as published by michael and scott
                         *
                         * however we reuse the tagged_ptr part for the freelist and clear the next part during node
                         * allocation. we can observe a null-pointer here.
                         * */
                        continue;
                    detail::copy_payload(next_ptr->data, ret);

                    tagged_node_handle new_head(pool.get_handle(next), head.get_next_tag());
                    if (head_.compare_exchange_weak(head, new_head)) {
                        pool.template destruct<true>(head);
                        return true;
                    }
                }
            }
        }
    }